

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

void __thiscall
BufferedReader::BufferedReader
          (BufferedReader *this,uint32_t blockSize,uint32_t allocSize,uint32_t prereadThreshold)

{
  uint local_40;
  uint32_t local_3c;
  uint32_t prereadThreshold_local;
  uint32_t allocSize_local;
  uint32_t blockSize_local;
  BufferedReader *this_local;
  
  AbstractReader::AbstractReader(&this->super_AbstractReader);
  TerminatableThread::TerminatableThread(&this->super_TerminatableThread);
  (this->super_AbstractReader)._vptr_AbstractReader = (_func_int **)&PTR__BufferedReader_00440380;
  (this->super_TerminatableThread)._vptr_TerminatableThread =
       (_func_int **)&PTR__BufferedReader_00440410;
  this->m_started = false;
  this->m_terminated = false;
  WaitableSafeQueue<int>::WaitableSafeQueue(&this->m_readQueue,0x1000);
  std::condition_variable::condition_variable(&this->m_readCond);
  std::mutex::mutex(&this->m_readMtx);
  this->m_id = 0;
  std::mutex::mutex(&this->m_readersMtx);
  std::map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  ::map(&this->m_readers);
  (this->super_AbstractReader).m_blockSize = blockSize;
  local_3c = blockSize;
  if (allocSize != 0) {
    local_3c = allocSize;
  }
  (this->super_AbstractReader).m_allocSize = local_3c;
  local_40 = prereadThreshold;
  if (prereadThreshold == 0) {
    local_40 = (this->super_AbstractReader).m_blockSize >> 1;
  }
  (this->super_AbstractReader).m_prereadThreshold = local_40;
  return;
}

Assistant:

BufferedReader::BufferedReader(const uint32_t blockSize, const uint32_t allocSize, const uint32_t prereadThreshold)
    : m_started(false), m_terminated(false), m_readQueue(QUEUE_MAX_SIZE), m_id(0)
{
    // size of the blocks being read
    m_blockSize = blockSize;
    // size of the memory reserved per-block (can exceed the block size, in which case the rest of the memory can be
    // used by the user)
    m_allocSize = allocSize ? allocSize : blockSize;
    // data preread threshold
    m_prereadThreshold = prereadThreshold ? prereadThreshold : m_blockSize / 2;
}